

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

xmlDtdPtr get_api_dtd(void)

{
  if ((((api_dtd == (xmlDtdPtr)0x0) || (api_dtd->type != XML_DTD_NODE)) &&
      (get_api_doc(), api_doc != (xmlDocPtr)0x0)) &&
     ((api_doc->children != (_xmlNode *)0x0 && (api_doc->children->type == XML_DTD_NODE)))) {
    api_dtd = (xmlDtdPtr)api_doc->children;
  }
  return api_dtd;
}

Assistant:

static xmlDtdPtr
get_api_dtd(void) {
    if ((api_dtd == NULL) || (api_dtd->type != XML_DTD_NODE)) {
        get_api_doc();
	if ((api_doc != NULL) && (api_doc->children != NULL) &&
	    (api_doc->children->type == XML_DTD_NODE))
	    api_dtd = (xmlDtdPtr) api_doc->children;
    }
    return(api_dtd);
}